

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O3

JL_STATUS OutputDictionaryKey(char *KeyName,JlBuffer *JsonBuffer,JL_OUTPUT_FLAGS OutputFlags)

{
  byte bVar1;
  char *pcVar2;
  JL_STATUS JVar3;
  size_t sVar4;
  size_t sVar5;
  
  if ((OutputFlags & 4) == 0) {
LAB_00102b34:
    pcVar2 = "\\\'";
    if ((OutputFlags & 8) == 0) {
      pcVar2 = "\\\"";
    }
    JlBufferAdd(JsonBuffer,pcVar2 + 1,1);
    sVar4 = strlen(KeyName);
    JlBufferAdd(JsonBuffer,KeyName,sVar4);
    sVar4 = 1;
    KeyName = pcVar2 + 1;
  }
  else {
    sVar4 = strlen(KeyName);
    if (sVar4 != 0) {
      sVar5 = 0;
      do {
        bVar1 = KeyName[sVar5];
        if ((((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x24)) && (bVar1 != 0x5f)) &&
           ((sVar5 == 0 || (9 < (byte)(bVar1 - 0x30))))) goto LAB_00102b34;
        sVar5 = sVar5 + 1;
      } while (sVar4 != sVar5);
    }
    sVar4 = strlen(KeyName);
  }
  JlBufferAdd(JsonBuffer,KeyName,sVar4);
  JVar3 = JlBufferAdd(JsonBuffer,": ",2 - (ulong)((OutputFlags & 2) == 0));
  return JVar3;
}

Assistant:

JL_STATUS
    OutputDictionaryKey
    (
        char const*             KeyName,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags
    )
{
    JL_STATUS jlStatus;
    bool noQuotes = false;
    char* quoteCharStr = "\"";

    if( OutputFlags & JL_OUTPUT_FLAGS_J5_USE_BARE_KEYWORDS )
    {
        // See if this qualifies as bare keyword
        if( CanKeyNameBeBare( KeyName ) )
        {
            noQuotes = true;
        }
    }
    if( !noQuotes && OutputFlags & JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES )
    {
        quoteCharStr = "\'";
    }

    if( !noQuotes )
    {
        jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
    }

    jlStatus = JlBufferAdd( JsonBuffer, KeyName, strlen(KeyName) );

    if( !noQuotes )
    {
        jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
    }
    jlStatus = JlBufferAdd( JsonBuffer, ": ", OutputFlags & JL_OUTPUT_FLAGS_INDENT ? 2 : 1 );

    return jlStatus;
}